

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

FileExpandResult __thiscall duckdb::GlobMultiFileList::GetExpandResult(GlobMultiFileList *this)

{
  FileExpandResult FVar1;
  long lVar2;
  OpenFileInfo local_40;
  
  (*(this->super_MultiFileList)._vptr_MultiFileList[8])(&local_40,this,1);
  OpenFileInfo::~OpenFileInfo(&local_40);
  lVar2 = (long)(this->expanded_files).
                super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->expanded_files).
                super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  FVar1 = MULTIPLE_FILES;
  if ((ulong)(lVar2 / 0x30) < 2) {
    FVar1 = lVar2 == 0x30;
  }
  return FVar1;
}

Assistant:

FileExpandResult GlobMultiFileList::GetExpandResult() {
	// GetFile(1) will ensure at least the first 2 files are expanded if they are available
	GetFile(1);

	if (expanded_files.size() > 1) {
		return FileExpandResult::MULTIPLE_FILES;
	} else if (expanded_files.size() == 1) {
		return FileExpandResult::SINGLE_FILE;
	}

	return FileExpandResult::NO_FILES;
}